

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isGatherResultValid<tcu::LookupPrecision,float>
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,
               CubeFaceFloatCoords *coords,int componentNdx,Vector<float,_4> *result)

{
  CubeFace face_;
  ulong uVar1;
  bool bVar2;
  int dim;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  ConstPixelBufferAccess *pCVar7;
  ulong uVar8;
  float *pfVar9;
  float fVar10;
  CubeFaceIntCoords CVar11;
  ConstPixelBufferAccess *local_1c8;
  Vector<float,_4> local_1c0;
  CubeFaceIntCoords local_1b0;
  CubeFaceCoords<int> local_1a0;
  undefined8 local_194;
  CubeFaceIntCoords c;
  int offNdx;
  Vector<float,_4> color;
  int local_164;
  int local_160;
  int i;
  int j;
  int face;
  ConstPixelBufferAccess faces [6];
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  int size;
  Vector<float,_4> *result_local;
  int componentNdx_local;
  CubeFaceFloatCoords *coords_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  TextureCubeView *texture_local;
  
  pCVar7 = TextureCubeView::getLevelFace(texture,0,coords->face);
  dim = ConstPixelBufferAccess::getWidth(pCVar7);
  bVar2 = sampler->normalizedCoords;
  fVar10 = coords->s;
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),dim,fVar10,iVar3,iVar4);
  bVar2 = sampler->normalizedCoords;
  fVar10 = coords->t;
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  iVar4 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),dim,fVar10,iVar3,iVar4);
  fVar10 = Vector<float,_2>::x(&vBounds);
  dVar5 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  local_160 = deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  faces[5].m_data._4_4_ = deFloorFloatToInt32(fVar10 - 0.5);
  local_1c8 = (ConstPixelBufferAccess *)&j;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_1c8);
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 != (ConstPixelBufferAccess *)&faces[5].m_data);
  for (i = 0; i < 6; i = i + 1) {
    pCVar7 = TextureCubeView::getLevelFace(texture,0,i);
    memcpy(&j + (long)i * 10,pCVar7,0x28);
  }
  do {
    local_164 = dVar5;
    if (faces[5].m_data._4_4_ < local_160) {
      return false;
    }
    for (; local_164 <= dVar6; local_164 = local_164 + 1) {
      if ((isGatherResultValid<tcu::LookupPrecision,float>(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::LookupPrecision_const&,tcu::CubeFaceCoords<float>const&,int,tcu::Vector<float,int>const&)
           ::offsets == '\0') &&
         (iVar3 = __cxa_guard_acquire(&isGatherResultValid<tcu::LookupPrecision,float>(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::LookupPrecision_const&,tcu::CubeFaceCoords<float>const&,int,tcu::Vector<float,int>const&)
                                       ::offsets), iVar3 != 0)) {
        Vector<int,_2>::Vector(isGatherResultValid<tcu::LookupPrecision,_float>::offsets,0,1);
        Vector<int,_2>::Vector(isGatherResultValid<tcu::LookupPrecision,_float>::offsets + 1,1,1);
        Vector<int,_2>::Vector(isGatherResultValid<tcu::LookupPrecision,_float>::offsets + 2,1,0);
        Vector<int,_2>::Vector(isGatherResultValid<tcu::LookupPrecision,_float>::offsets + 3,0,0);
        __cxa_guard_release(&isGatherResultValid<tcu::LookupPrecision,float>(tcu::TextureCubeView_const&,tcu::Sampler_const&,tcu::LookupPrecision_const&,tcu::CubeFaceCoords<float>const&,int,tcu::Vector<float,int>const&)
                             ::offsets);
      }
      Vector<float,_4>::Vector((Vector<float,_4> *)&c.t);
      for (c.s = 0; c.s < 4; c.s = c.s + 1) {
        face_ = coords->face;
        iVar3 = Vector<int,_2>::x(isGatherResultValid<tcu::LookupPrecision,_float>::offsets + c.s);
        iVar4 = Vector<int,_2>::y(isGatherResultValid<tcu::LookupPrecision,_float>::offsets + c.s);
        CubeFaceCoords<int>::CubeFaceCoords(&local_1a0,face_,local_164 + iVar3,local_160 + iVar4);
        CVar11 = remapCubeEdgeCoords(&local_1a0,dim);
        local_1b0._0_8_ = CVar11._0_8_;
        local_194._0_4_ = local_1b0.face;
        local_194._4_4_ = local_1b0.s;
        uVar1 = local_194;
        local_1b0.t = CVar11.t;
        c.face = local_1b0.t;
        local_194._0_4_ = CVar11.face;
        if ((CubeFace)local_194 == CUBEFACE_LAST) {
          return true;
        }
        uVar8 = local_1b0._0_8_ & 0xffffffff;
        local_194._4_4_ = CVar11.s;
        iVar3 = local_194._4_4_;
        iVar4 = local_1b0.t;
        local_1b0 = CVar11;
        local_194 = uVar1;
        lookup<float>((tcu *)&local_1c0,(ConstPixelBufferAccess *)(&j + uVar8 * 10),sampler,iVar3,
                      iVar4,0);
        pfVar9 = Vector<float,_4>::operator[](&local_1c0,componentNdx);
        fVar10 = *pfVar9;
        pfVar9 = Vector<float,_4>::operator[]((Vector<float,_4> *)&c.t,c.s);
        *pfVar9 = fVar10;
      }
      bVar2 = isColorValid(prec,(Vec4 *)&c.t,result);
      if (bVar2) {
        return true;
      }
    }
    local_160 = local_160 + 1;
  } while( true );
}

Assistant:

static bool isGatherResultValid (const TextureCubeView&			texture,
								 const Sampler&					sampler,
								 const PrecType&				prec,
								 const CubeFaceFloatCoords&		coords,
								 int							componentNdx,
								 const Vector<ScalarType, 4>&	result)
{
	const int	size		= texture.getLevelFace(0, coords.face).getWidth();

	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.s, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, size, coords.t, prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	// Face accesses
	ConstPixelBufferAccess faces[CUBEFACE_LAST];
	for (int face = 0; face < CUBEFACE_LAST; face++)
		faces[face] = texture.getLevelFace(0, CubeFace(face));

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			static const IVec2 offsets[4] =
			{
				IVec2(0, 1),
				IVec2(1, 1),
				IVec2(1, 0),
				IVec2(0, 0)
			};

			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				const CubeFaceIntCoords c = remapCubeEdgeCoords(CubeFaceIntCoords(coords.face, i+offsets[offNdx].x(), j+offsets[offNdx].y()), size);
				// If any of samples is out of both edges, implementations can do pretty much anything according to spec.
				// \todo [2014-06-05 nuutti] Test the special case where all corner pixels have exactly the same color.
				//							 See also isSeamlessLinearSampleResultValid and similar.
				if (c.face == CUBEFACE_LAST)
					return true;

				color[offNdx] = lookup<ScalarType>(faces[c.face], sampler, c.s, c.t, 0)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}